

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O1

void __thiscall IlmThread_2_5::anon_unknown_5::DefaultWorkerThread::run(DefaultWorkerThread *this)

{
  DefaultWorkData *pDVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  Task *pTVar4;
  TaskGroup *pTVar5;
  Data *pDVar6;
  int iVar7;
  byte bVar8;
  void *in_RSI;
  Mutex *__mutex;
  
  Semaphore::post(&this->_data->threadSemaphore);
  do {
    Semaphore::wait(&this->_data->taskSemaphore,in_RSI);
    __mutex = &this->_data->taskMutex;
    iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar7 != 0) {
      std::__throw_system_error(iVar7);
    }
    pDVar1 = this->_data;
    ppTVar2 = (pDVar1->tasks).
              super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppTVar3 = (pDVar1->tasks).
              super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppTVar2 == ppTVar3) {
      bVar8 = (pDVar1->stopping)._M_base._M_i ^ 1;
    }
    else {
      pTVar4 = ppTVar3[-1];
      (pDVar1->tasks).
      super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppTVar3 + -1;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pTVar5 = pTVar4->_group;
      (*pTVar4->_vptr_Task[2])(pTVar4);
      (*pTVar4->_vptr_Task[1])(pTVar4);
      pDVar6 = pTVar5->_data;
      LOCK();
      (pDVar6->numPending).super___atomic_base<int>._M_i =
           (pDVar6->numPending).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      bVar8 = 1;
      if ((pDVar6->numPending).super___atomic_base<int>._M_i == 0) {
        Semaphore::post(&pDVar6->isEmpty);
      }
    }
    if (ppTVar2 == ppTVar3) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
  } while ((bVar8 & 1) != 0);
  return;
}

Assistant:

void
DefaultWorkerThread::run ()
{
    //
    // Signal that the thread has started executing
    //

    _data->threadSemaphore.post();

    while (true)
    {
        //
        // Wait for a task to become available
        //

        _data->taskSemaphore.wait();

        {
            Lock taskLock (_data->taskMutex);
    
            //
            // If there is a task pending, pop off the next task in the FIFO
            //

            if (!_data->tasks.empty())
            {
                Task* task = _data->tasks.back();
                _data->tasks.pop_back();
                taskLock.release();

                TaskGroup* taskGroup = task->group();
                task->execute();

                delete task;

                taskGroup->_data->removeTask ();
            }
            else if (_data->stopped())
            {
                break;
            }
        }
    }
}